

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,uchar c)

{
  CBStringException *pCVar1;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  uchar c_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf] = c;
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"CBString::Write protection error",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_40);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if ((this->super_tagbstring).mlen < 3) {
    alloc(this,2);
  }
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c0,"CBString::Failure in =(char) operator",&local_c1);
    CBStringException::CBStringException((CBStringException *)local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_a0);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  (this->super_tagbstring).slen = 1;
  *(this->super_tagbstring).data = bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf];
  (this->super_tagbstring).data[1] = '\0';
  return this;
}

Assistant:

const CBString& CBString::operator = (unsigned char c) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (2 >= mlen) alloc (2);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in =(char) operator");
	} else {
		slen = 1;
		data[0] = c;
		data[1] = '\0';
	}
	return *this;
}